

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

void lj_debug_dumpstack(lua_State *L,SBuf *sb,char *fmt,int depth)

{
  byte bVar1;
  int iVar2;
  cTValue *pcVar3;
  GCfunc *fn;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  byte *pbVar7;
  uint uVar8;
  byte *pbVar9;
  int size;
  char *name;
  int local_70;
  int local_6c;
  lua_State *local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  byte *local_50;
  cTValue *local_48;
  cTValue *local_40;
  char *local_38;
  
  uVar8 = 0xffffffff;
  if (depth < -1) {
    uVar8 = depth;
  }
  uVar8 = ~uVar8;
  local_58 = 0xffffffff;
  if (-1 < depth) {
    local_58 = depth;
  }
  if (local_58 != uVar8) {
    local_5c = depth >> 0x1f | 1;
    local_70 = 0;
    local_68 = L;
    local_60 = depth;
    local_50 = (byte *)fmt;
    do {
      pcVar3 = lj_debug_frame(local_68,uVar8,&local_6c);
      if (pcVar3 != (cTValue *)0x0) {
        local_48 = pcVar3 + local_6c;
        if ((long)local_6c == 0) {
          local_48 = (cTValue *)0x0;
        }
        fn = (GCfunc *)(ulong)(pcVar3->u32).lo;
        pbVar9 = local_50;
        local_54 = uVar8;
        local_40 = pcVar3;
LAB_0011268a:
        while( true ) {
          bVar1 = *pbVar9;
          pbVar9 = pbVar9 + 1;
          if (0x65 < bVar1) goto code_r0x0011269d;
          if (bVar1 == 0x46) goto LAB_001126d4;
          if (bVar1 != 0x5a) break;
          local_70 = (sb->p).ptr32 - (sb->b).ptr32;
        }
        uVar8 = local_54;
        if (bVar1 != 0) goto LAB_00112811;
        goto LAB_001128bf;
      }
      if (-1 < local_60) break;
      uVar8 = uVar8 - local_6c;
LAB_001128bf:
      uVar8 = uVar8 + local_5c;
    } while (uVar8 != local_58);
    if (local_70 != 0) {
      (sb->p).ptr32 = local_70 + (sb->b).ptr32;
    }
  }
  return;
code_r0x0011269d:
  if (bVar1 == 0x70) goto LAB_0011268a;
  if (bVar1 != 0x6c) {
    if (bVar1 != 0x66) {
LAB_00112811:
      uVar8 = (sb->p).ptr32;
      pbVar7 = (byte *)(ulong)uVar8;
      if ((sb->e).ptr32 == uVar8) {
        pbVar7 = (byte *)lj_buf_more2(sb,1);
      }
      iVar2 = (int)pbVar7;
      *pbVar7 = bVar1;
      goto LAB_0011281e;
    }
LAB_001126d4:
    pcVar4 = lj_debug_funcname(local_68,local_40,&local_38);
    if (pcVar4 != (char *)0x0) {
      if ((bVar1 == 0x46) && ((fn->c).ffid == '\0')) {
        uVar5 = (ulong)(fn->c).pc.ptr32;
        iVar2 = *(int *)(uVar5 - 0x14);
        if (iVar2 != -1) {
          debug_putchunkname(sb,(GCproto *)(ulong)*(uint *)(uVar5 - 0x18),iVar2);
          uVar8 = (sb->p).ptr32;
          pcVar4 = (char *)(ulong)uVar8;
          if ((sb->e).ptr32 == uVar8) {
            pcVar4 = lj_buf_more2(sb,1);
          }
          *pcVar4 = ':';
          (sb->p).ptr32 = (int)pcVar4 + 1;
        }
      }
      pcVar4 = local_38;
      sVar6 = strlen(local_38);
      lj_buf_putmem(sb,pcVar4,(MSize)sVar6);
      goto LAB_0011268a;
    }
  }
  if ((fn->c).ffid == '\x01') {
    uVar8 = (sb->p).ptr32;
    pcVar4 = (char *)(ulong)uVar8;
    if ((sb->e).ptr32 == uVar8) {
      pcVar4 = lj_buf_more2(sb,1);
    }
    *pcVar4 = '@';
    (sb->p).ptr32 = (int)pcVar4 + 1;
    lj_strfmt_putptr(sb,(fn->c).f);
    goto LAB_0011268a;
  }
  if ((fn->c).ffid == '\0') {
    uVar5 = (ulong)(fn->c).pc.ptr32;
    iVar2 = debug_putchunkname(sb,(GCproto *)(ulong)*(uint *)(uVar5 - 0x18),*(int *)(uVar5 - 0x14));
    if (iVar2 != 0) {
      if (bVar1 == 0x6c) {
        iVar2 = lj_debug_frameline(local_68,fn,local_48);
      }
      else {
        iVar2 = *(int *)(uVar5 - 0x14);
      }
      uVar8 = (sb->p).ptr32;
      pcVar4 = (char *)(ulong)uVar8;
      if ((sb->e).ptr32 == uVar8) {
        pcVar4 = lj_buf_more2(sb,1);
      }
      *pcVar4 = ':';
      (sb->p).ptr32 = (int)pcVar4 + 1;
      if (iVar2 < 0) {
        iVar2 = *(int32_t *)(uVar5 - 0x14);
      }
      lj_strfmt_putint(sb,iVar2);
    }
    goto LAB_0011268a;
  }
  lj_buf_putmem(sb,"[builtin#",9);
  lj_strfmt_putint(sb,(uint)(fn->c).ffid);
  uVar8 = (sb->p).ptr32;
  pcVar4 = (char *)(ulong)uVar8;
  if ((sb->e).ptr32 == uVar8) {
    pcVar4 = lj_buf_more2(sb,1);
  }
  iVar2 = (int)pcVar4;
  *pcVar4 = ']';
LAB_0011281e:
  (sb->p).ptr32 = iVar2 + 1;
  goto LAB_0011268a;
}

Assistant:

void lj_debug_dumpstack(lua_State *L, SBuf *sb, const char *fmt, int depth)
{
  int level = 0, dir = 1, pathstrip = 1;
  MSize lastlen = 0;
  if (depth < 0) { level = ~depth; depth = dir = -1; }  /* Reverse frames. */
  while (level != depth) {  /* Loop through all frame. */
    int size;
    cTValue *frame = lj_debug_frame(L, level, &size);
    if (frame) {
      cTValue *nextframe = size ? frame+size : NULL;
      GCfunc *fn = frame_func(frame);
      const uint8_t *p = (const uint8_t *)fmt;
      int c;
      while ((c = *p++)) {
	switch (c) {
	case 'p':  /* Preserve full path. */
	  pathstrip = 0;
	  break;
	case 'F': case 'f': {  /* Dump function name. */
	  const char *name;
	  const char *what = lj_debug_funcname(L, frame, &name);
	  if (what) {
	    if (c == 'F' && isluafunc(fn)) {  /* Dump module:name for 'F'. */
	      GCproto *pt = funcproto(fn);
	      if (pt->firstline != ~(BCLine)0) {  /* Not a bytecode builtin. */
		debug_putchunkname(sb, pt, pathstrip);
		lj_buf_putb(sb, ':');
	      }
	    }
	    lj_buf_putmem(sb, name, (MSize)strlen(name));
	    break;
	  }  /* else: can't derive a name, dump module:line. */
	  }
	  /* fallthrough */
	case 'l':  /* Dump module:line. */
	  if (isluafunc(fn)) {
	    GCproto *pt = funcproto(fn);
	    if (debug_putchunkname(sb, pt, pathstrip)) {
	      /* Regular Lua function. */
	      BCLine line = c == 'l' ? lj_debug_frameline(L, fn, nextframe) :
				       pt->firstline;
	      lj_buf_putb(sb, ':');
	      lj_strfmt_putint(sb, line >= 0 ? line : pt->firstline);
	    }
	  } else if (isffunc(fn)) {  /* Dump numbered builtins. */
	    lj_buf_putmem(sb, "[builtin#", 9);
	    lj_strfmt_putint(sb, fn->c.ffid);
	    lj_buf_putb(sb, ']');
	  } else {  /* Dump C function address. */
	    lj_buf_putb(sb, '@');
	    lj_strfmt_putptr(sb, fn->c.f);
	  }
	  break;
	case 'Z':  /* Zap trailing separator. */
	  lastlen = sbuflen(sb);
	  break;
	default:
	  lj_buf_putb(sb, c);
	  break;
	}
      }
    } else if (dir == 1) {
      break;
    } else {
      level -= size;  /* Reverse frame order: quickly skip missing level. */
    }
    level += dir;
  }
  if (lastlen)
    setsbufP(sb, sbufB(sb) + lastlen);  /* Zap trailing separator. */
}